

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::z_formatter<spdlog::details::null_scoped_padder>::format
          (z_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,tm *tm_time,
          memory_buf_t *dest)

{
  char local_3c [4];
  int local_38;
  bool is_negative;
  int total_minutes;
  null_scoped_padder p;
  size_t field_size;
  memory_buf_t *dest_local;
  tm *tm_time_local;
  log_msg *msg_local;
  z_formatter<spdlog::details::null_scoped_padder> *this_local;
  
  _total_minutes = 6;
  null_scoped_padder::null_scoped_padder
            ((null_scoped_padder *)&is_negative,6,&(this->super_flag_formatter).padinfo_,dest);
  local_38 = get_cached_offset(this,msg,tm_time);
  local_3c[3] = local_38 < 0;
  if ((bool)local_3c[3]) {
    local_38 = -local_38;
    local_3c[2] = 0x2d;
    ::fmt::v7::detail::buffer<char>::push_back(&dest->super_buffer<char>,local_3c + 2);
  }
  else {
    local_3c[1] = 0x2b;
    ::fmt::v7::detail::buffer<char>::push_back(&dest->super_buffer<char>,local_3c + 1);
  }
  fmt_helper::pad2(local_38 / 0x3c,dest);
  local_3c[0] = ':';
  ::fmt::v7::detail::buffer<char>::push_back(&dest->super_buffer<char>,local_3c);
  fmt_helper::pad2(local_38 % 0x3c,dest);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 6;
        ScopedPadder p(field_size, padinfo_, dest);

        auto total_minutes = get_cached_offset(msg, tm_time);
        bool is_negative = total_minutes < 0;
        if (is_negative)
        {
            total_minutes = -total_minutes;
            dest.push_back('-');
        }
        else
        {
            dest.push_back('+');
        }

        fmt_helper::pad2(total_minutes / 60, dest); // hours
        dest.push_back(':');
        fmt_helper::pad2(total_minutes % 60, dest); // minutes
    }